

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O1

void encode_block_inter(int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                       TX_SIZE tx_size,void *arg,RUN_TYPE dry_run)

{
  CommonQuantParams *quant_params;
  byte bVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  MACROBLOCK *x;
  MB_MODE_INFO *pMVar6;
  MACROBLOCKD *xd;
  ulong uVar7;
  byte *pbVar8;
  byte bVar9;
  ENTROPY_CONTEXT *l;
  long lVar10;
  long lVar11;
  size_t __n;
  int iVar12;
  long lVar13;
  undefined7 in_register_00000081;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  size_t __n_00;
  int iVar18;
  long lVar19;
  TX_TYPE local_dc;
  int dummy_rate_cost;
  macroblockd_plane *local_b0;
  MACROBLOCKD *local_a8;
  long local_a0;
  ENTROPY_CONTEXT *local_98;
  long local_90;
  uint8_t *local_88;
  tran_low_t *local_80;
  TXB_CTX local_78;
  QUANT_PARAM quant_param;
  TxfmParam txfm_param;
  
  x = *(MACROBLOCK **)((long)arg + 8);
  lVar13 = (long)plane;
  uVar7 = CONCAT71(in_register_00000081,plane_bsize) & 0xffffffff;
  uVar16 = (uint)block_size_high[uVar7];
  iVar17 = (x->e_mbd).mb_to_bottom_edge;
  if (iVar17 < 0) {
    uVar16 = (uint)block_size_high[uVar7] +
             (iVar17 >> ((char)(x->e_mbd).plane[lVar13].subsampling_y + 3U & 0x1f));
  }
  uVar14 = (uint)block_size_wide[uVar7];
  iVar17 = (x->e_mbd).mb_to_right_edge;
  if (iVar17 < 0) {
    uVar14 = (uint)block_size_wide[uVar7] +
             (iVar17 >> ((char)(x->e_mbd).plane[lVar13].subsampling_x + 3U & 0x1f));
  }
  iVar17 = ((int)uVar16 >> 2) - blk_row;
  if (iVar17 == 0 || (int)uVar16 >> 2 < blk_row) {
    return;
  }
  iVar15 = ((int)uVar14 >> 2) - blk_col;
  if (iVar15 == 0 || (int)uVar14 >> 2 < blk_col) {
    return;
  }
  uVar16 = (uint)tx_size;
  pMVar6 = *(x->e_mbd).mi;
  local_b0 = (x->e_mbd).plane + lVar13;
  if (plane == 0) {
    bVar9 = pMVar6->inter_tx_size
            [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[uVar7] & 0x1f)) +
             ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[uVar7] & 0x1f)) <<
             (av1_get_txb_size_index_stride_log2_table[uVar7] & 0x1f))];
  }
  else {
    bVar1 = ""[av1_ss_size_lookup[pMVar6->bsize][(x->e_mbd).plane[lVar13].subsampling_x]
               [(x->e_mbd).plane[lVar13].subsampling_y]];
    if (bVar1 < 0x11) {
      bVar9 = 3;
      if ((1 < bVar1 - 0xb) && (bVar1 != 4)) {
        bVar9 = bVar1;
      }
    }
    else if (bVar1 == 0x11) {
      bVar9 = 9;
    }
    else {
      bVar9 = bVar1;
      if (bVar1 == 0x12) {
        bVar9 = 10;
      }
    }
  }
  if ((plane == 0) && (bVar9 != tx_size)) {
    iVar4 = *(int *)((long)tx_size_high_unit + (ulong)(uVar16 * 4));
    if (iVar4 < iVar17) {
      iVar17 = iVar4;
    }
    iVar4 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar16 * 4));
    if (iVar4 < iVar15) {
      iVar15 = iVar4;
    }
    if (iVar17 < 1) {
      return;
    }
    bVar9 = ""[tx_size];
    iVar4 = tx_size_wide_unit[bVar9];
    iVar5 = tx_size_high_unit[bVar9];
    iVar12 = 0;
    do {
      if (0 < iVar15) {
        iVar18 = 0;
        do {
          encode_block_inter(0,block,blk_row + iVar12,blk_col + iVar18,plane_bsize,bVar9,arg,dry_run
                            );
          block = block + iVar5 * iVar4;
          iVar18 = iVar18 + iVar4;
        } while (iVar18 < iVar15);
      }
      iVar12 = iVar12 + iVar5;
    } while (iVar12 < iVar17);
    return;
  }
  local_a8 = &x->e_mbd;
  lVar11 = *arg;
  lVar19 = lVar13 * 0x88;
  local_80 = x->plane[lVar13].dqcoeff + (block << 4);
  dummy_rate_cost = 0;
  local_90 = (long)blk_col;
  local_98 = (ENTROPY_CONTEXT *)(*(long *)((long)arg + 0x18) + local_90);
  l = (ENTROPY_CONTEXT *)(*(long *)((long)arg + 0x20) + (long)blk_row);
  lVar10 = (long)block;
  local_88 = (x->e_mbd).plane[lVar13].dst.buf +
             ((x->e_mbd).plane[lVar13].dst.stride * blk_row + blk_col) * 4;
  local_a0 = lVar19;
  if (((x->txfm_search_info).blk_skip
       [(int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [uVar7] * blk_row + blk_col)] >> (plane & 0x1fU) & 1) == 0) {
    uVar3 = *(ushort *)&pMVar6->field_0xa7;
    if ((uVar3 & 0x40) == 0) {
      if ((x->e_mbd).lossless[uVar3 & 7] == 0) {
        if ((0x61810UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
          uVar7 = (ulong)local_b0->plane_type;
          if (uVar7 == 0) {
            local_dc = (x->e_mbd).tx_type_map[(x->e_mbd).tx_type_map_stride * blk_row + blk_col];
          }
          else {
            if (((char)uVar3 < '\0') || ('\0' < pMVar6->ref_frame[0])) {
              pbVar8 = (x->e_mbd).tx_type_map +
                       ((blk_row << ((byte)(x->e_mbd).plane[uVar7].subsampling_y & 0x1f)) *
                        (x->e_mbd).tx_type_map_stride +
                       (blk_col << ((byte)(x->e_mbd).plane[uVar7].subsampling_x & 0x1f)));
            }
            else {
              pbVar8 = intra_mode_to_tx_type__intra_mode_to_tx_type +
                       (byte)get_uv_mode_uv2y[pMVar6->uv_mode];
            }
            uVar14 = 1;
            if (-1 < (char)uVar3) {
              uVar14 = (uint)('\0' < pMVar6->ref_frame[0]);
            }
            if ((0x18608UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
              if (*(char *)(lVar11 + 0x3c175) != '\0') {
                uVar14 = (uint)(byte)((uVar14 == 0) + 1);
                goto LAB_001b68e6;
              }
              bVar9 = av1_ext_tx_set_lookup[0]
                      [(ulong)((0x60604UL >> ((ulong)tx_size & 0x3f) & 1) != 0) +
                       (ulong)(uVar14 * 2)];
            }
            else {
LAB_001b68e6:
              bVar9 = (byte)uVar14;
            }
            uVar14 = av1_ext_tx_used[bVar9][*pbVar8];
            if (av1_ext_tx_used[bVar9][*pbVar8] != 0) {
              uVar14 = (uint)*pbVar8;
            }
            local_dc = (TX_TYPE)uVar14;
          }
        }
        else {
          local_dc = '\0';
        }
      }
      else {
        local_dc = '\0';
      }
      cVar2 = *(char *)((long)arg + 0x29);
      av1_setup_xform((AV1_COMMON *)(lVar11 + 0x3bf80),x,tx_size,local_dc,&txfm_param);
      iVar17 = *(int *)(lVar11 + 0x423fc);
      quant_param.log_scale = av1_get_tx_scale(tx_size);
      xd = local_a8;
      quant_param.qmatrix = (qm_val_t *)0x0;
      quant_param.iqmatrix = (qm_val_t *)0x0;
      quant_params = (CommonQuantParams *)(lVar11 + 0x3c1e8);
      quant_param.tx_size = tx_size;
      quant_param.use_quant_b_adapt = iVar17;
      quant_param.use_optimize_b = (uint)((dry_run == '\0' || cVar2 != '\x02') && cVar2 != '\0');
      quant_param.xform_quant_idx = (uint)(dry_run != '\0' && cVar2 == '\x02' || cVar2 == '\0');
      quant_param.qmatrix = av1_get_qmatrix(quant_params,local_a8,plane,tx_size,local_dc);
      quant_param.iqmatrix = av1_get_iqmatrix(quant_params,xd,plane,tx_size,local_dc);
      av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param,&quant_param);
      if (quant_param.use_optimize_b != 0) {
        get_txb_ctx(plane_bsize,tx_size,plane,local_98,l,&local_78);
        av1_optimize_b(*arg,x,plane,block,tx_size,local_dc,&local_78,&dummy_rate_cost);
      }
      lVar19 = local_a0;
      if (quant_param.use_optimize_b == 0) {
        av1_dropout_qcoeff(x,plane,block,tx_size,local_dc,quant_params->base_qindex);
      }
      goto LAB_001b66a5;
    }
  }
  x->plane[lVar13].eobs[lVar10] = 0;
  x->plane[lVar13].txb_entropy_ctx[lVar10] = '\0';
  local_dc = '\0';
LAB_001b66a5:
  __n_00 = (size_t)*(int *)((long)tx_size_wide_unit + (ulong)(uVar16 * 4));
  uVar14 = (uint)*(byte *)(*(long *)((long)&x->plane[0].txb_entropy_ctx + lVar19) + lVar10);
  memset(local_98,uVar14,__n_00);
  __n = (size_t)*(int *)((long)tx_size_high_unit + (ulong)(uVar16 * 4));
  memset(l,uVar14,__n);
  uVar3 = x->plane[lVar13].eobs[lVar10];
  if (uVar3 == 0) {
    pMVar6->skip_txfm = pMVar6->skip_txfm & 1;
  }
  else {
    pMVar6->skip_txfm = '\0';
    av1_inverse_transform_block
              (local_a8,local_80,plane,local_dc,tx_size,local_88,(local_b0->dst).stride,(uint)uVar3,
               (uint)*(byte *)(lVar11 + 0x3c175));
  }
  if ((plane == 0) && (x->plane[lVar13].eobs[lVar10] == 0)) {
    iVar17 = (x->e_mbd).tx_type_map_stride;
    (x->e_mbd).tx_type_map[blk_row * iVar17 + blk_col] = '\0';
    if (((0x41010UL >> ((ulong)uVar16 & 0x3f) & 1) != 0) ||
       ((0x20810UL >> ((ulong)uVar16 & 0x3f) & 1) != 0)) {
      local_90 = (long)blk_row * (long)iVar17 + local_90;
      lVar13 = 0;
      do {
        lVar11 = 0;
        do {
          (x->e_mbd).tx_type_map[lVar11 + local_90] = '\0';
          lVar11 = lVar11 + 4;
        } while (lVar11 < (long)__n_00);
        lVar13 = lVar13 + 4;
        local_90 = local_90 + (long)iVar17 * 4;
      } while (lVar13 < (long)__n);
    }
  }
  return;
}

Assistant:

static void encode_block_inter(int plane, int block, int blk_row, int blk_col,
                               BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                               void *arg, RUN_TYPE dry_run) {
  struct encode_b_args *const args = arg;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];
  if (!plane) {
    assert(tx_size_wide[tx_size] >= tx_size_wide[plane_tx_size] &&
           tx_size_high[tx_size] >= tx_size_high[plane_tx_size]);
  }

  if (tx_size == plane_tx_size || plane) {
    encode_block(plane, block, blk_row, blk_col, plane_bsize, tx_size, arg,
                 dry_run);
  } else {
    assert(tx_size < TX_SIZES_ALL);
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    assert(IMPLIES(tx_size <= TX_4X4, sub_txs == tx_size));
    assert(IMPLIES(tx_size > TX_4X4, sub_txs < tx_size));
    // This is the square transform block partition entry point.
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int step = bsh * bsw;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    assert(bsw > 0 && bsh > 0);

    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;

        encode_block_inter(plane, block, offsetr, offsetc, plane_bsize, sub_txs,
                           arg, dry_run);
        block += step;
      }
    }
  }
}